

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char_*>
fmt::v7::detail::format_decimal<char,unsigned_int>(char *out,uint value,int size)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  format_decimal_result<char_*> fVar5;
  
  iVar3 = count_digits(value);
  if (iVar3 <= size) {
    pcVar1 = out + size;
    uVar2 = (ulong)value;
    while( true ) {
      pcVar4 = pcVar1 + -2;
      if ((uint)uVar2 < 100) break;
      *(undefined2 *)pcVar4 = *(undefined2 *)(basic_data<void>::digits + (uVar2 % 100) * 2);
      pcVar1 = pcVar4;
      uVar2 = uVar2 / 100;
    }
    if ((uint)uVar2 < 10) {
      pcVar1[-1] = (byte)uVar2 | 0x30;
      pcVar4 = pcVar1 + -1;
    }
    else {
      *(undefined2 *)pcVar4 = *(undefined2 *)(basic_data<void>::digits + uVar2 * 2);
    }
    fVar5.end = out + size;
    fVar5.begin = pcVar4;
    return fVar5;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
              ,0x41b,"invalid digit count");
}

Assistant:

inline format_decimal_result<Char*> format_decimal(Char* out, UInt value,
                                                   int size) {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, data::digits[value % 100]);
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, data::digits[value]);
  return {out, end};
}